

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O0

bool __thiscall cmParsePHPCoverage::ReadFileInformation(cmParsePHPCoverage *this,istream *in)

{
  cmCTest *pcVar1;
  istream *piVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  long *plVar7;
  pointer pcVar8;
  type pcVar9;
  string local_540 [32];
  undefined1 local_520 [8];
  ostringstream cmCTestLog_msg_2;
  string local_3a8 [32];
  undefined1 local_388 [8];
  ostringstream cmCTestLog_msg_1;
  allocator<char> local_209;
  undefined1 local_208 [8];
  string fileName;
  unique_ptr<char[],_std::default_delete<char[]>_> local_1e0;
  __array s;
  int size;
  char c;
  ostringstream local_1a0 [8];
  ostringstream cmCTestLog_msg;
  char local_24 [2];
  undefined1 local_22;
  istream *piStack_20;
  char buf [4];
  istream *in_local;
  cmParsePHPCoverage *this_local;
  
  piStack_20 = in;
  std::istream::read((char *)in,(long)local_24);
  local_22 = 0;
  iVar4 = strcmp(local_24,"s:");
  if (iVar4 == 0) {
    s._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl._0_4_ = 0;
    bVar3 = ReadInt(this,piStack_20,(int *)&s);
    if (bVar3) {
      s._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl._0_4_ =
           (int)s._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                super__Head_base<0UL,_char_*,_false>._M_head_impl + 1;
      std::make_unique<char[]>((size_t)&local_1e0);
      plVar7 = (long *)std::istream::get((char *)piStack_20);
      bVar3 = std::ios::operator_cast_to_bool((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
      piVar2 = piStack_20;
      if ((bVar3) &&
         (s._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl._7_1_ != '\"')) {
        this_local._7_1_ = false;
        fileName.field_2._12_4_ = 1;
      }
      else {
        pcVar8 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_1e0);
        std::istream::read((char *)piVar2,(long)pcVar8);
        pcVar9 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                           (&local_1e0,
                            (long)((int)s._M_t.
                                        super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>
                                        .super__Head_base<0UL,_char_*,_false>._M_head_impl + -1));
        *pcVar9 = '\0';
        pcVar8 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_1e0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_208,pcVar8,&local_209);
        std::allocator<char>::~allocator(&local_209);
        plVar7 = (long *)std::istream::get((char *)piStack_20);
        bVar3 = std::ios::operator_cast_to_bool((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
        if ((bVar3) &&
           (s._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
            super__Head_base<0UL,_char_*,_false>._M_head_impl._7_1_ != '\"')) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_388);
          poVar5 = std::operator<<((ostream *)local_388,"failed to read close quote\n");
          poVar5 = std::operator<<(poVar5,"read [");
          poVar5 = std::operator<<(poVar5,s._M_t.
                                          super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>
                                          .super__Head_base<0UL,_char_*,_false>._M_head_impl._7_1_);
          std::operator<<(poVar5,"]\n");
          pcVar1 = this->CTest;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParsePHPCoverage.cxx"
                       ,0xa0,pcVar6,false);
          std::__cxx11::string::~string(local_3a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_388);
          this_local._7_1_ = false;
        }
        else {
          bVar3 = ReadCoverageArray(this,piStack_20,(string *)local_208);
          if (bVar3) {
            this_local._7_1_ = true;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_520);
            poVar5 = std::operator<<((ostream *)local_520,"failed to read coverage array for file: "
                                    );
            poVar5 = std::operator<<(poVar5,(string *)local_208);
            std::operator<<(poVar5,"\n");
            pcVar1 = this->CTest;
            std::__cxx11::ostringstream::str();
            pcVar6 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParsePHPCoverage.cxx"
                         ,0xa6,pcVar6,false);
            std::__cxx11::string::~string(local_540);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_520);
            this_local._7_1_ = false;
          }
        }
        fileName.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_208);
      }
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_1e0);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar5 = std::operator<<((ostream *)local_1a0,"failed to read start of file info found: [");
    poVar5 = std::operator<<(poVar5,local_24);
    std::operator<<(poVar5,"]\n");
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParsePHPCoverage.cxx"
                 ,0x8c,pcVar6,false);
    std::__cxx11::string::~string((string *)&size);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmParsePHPCoverage::ReadFileInformation(std::istream& in)
{
  char buf[4];
  in.read(buf, 2);
  buf[2] = 0;
  if (strcmp(buf, "s:") != 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "failed to read start of file info found: [" << buf << "]\n");
    return false;
  }
  char c;
  int size = 0;
  if (this->ReadInt(in, size)) {
    size++; // add one for null termination
    auto s = cm::make_unique<char[]>(size + 1);
    // read open quote
    if (in.get(c) && c != '"') {
      return false;
    }
    // read the string data
    in.read(s.get(), size - 1);
    s[size - 1] = 0;
    std::string fileName = s.get();
    // read close quote
    if (in.get(c) && c != '"') {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "failed to read close quote\n"
                   << "read [" << c << "]\n");
      return false;
    }
    if (!this->ReadCoverageArray(in, fileName)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "failed to read coverage array for file: " << fileName
                                                            << "\n");
      return false;
    }
    return true;
  }
  return false;
}